

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allergen-assessment.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int *piVar3;
  basic_ifstream<char,_std::char_traits<char>_> *file_00;
  size_type __n;
  iterator iVar4;
  const_iterator __first;
  const_iterator __last;
  unsigned_long uVar5;
  undefined1 local_380 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  allergen_food;
  string a2;
  unsigned_long a1;
  allocator<unsigned_long> local_2e9;
  undefined1 local_2e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> occurence;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  safe;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allergens;
  foods_t foods;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  basic_ifstream<char,_std::char_traits<char>_> *input;
  undefined1 local_228 [8];
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
  super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._520_8_ = argv;
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228,2,argv)
    ;
    bVar1 = std::holds_alternative<int,int,std::ifstream>
                      ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                       local_228);
    if (bVar1) {
      piVar3 = std::get<int,int,std::ifstream>
                         ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                          local_228);
      argv_local._4_4_ = *piVar3;
    }
    else {
      file_00 = std::get<std::ifstream,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           local_228);
      tokenize_abi_cxx11_<std::ifstream>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,file_00);
      read_foods<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((foods_t *)&allergens._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      all_allergens_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&safe._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (foods_t *)&allergens._M_t._M_impl.super__Rb_tree_header._M_node_count);
      safe_ingredients_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (foods_t *)&allergens._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __n = std::vector<ingredientlist_t,_std::allocator<ingredientlist_t>_>::size
                      ((vector<ingredientlist_t,_std::allocator<ingredientlist_t>_> *)
                       &allergens._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::allocator<unsigned_long>::allocator(&local_2e9);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e8,__n,&local_2e9);
      std::allocator<unsigned_long>::~allocator(&local_2e9);
      iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e8);
      std::ranges::__transform_fn::
      operator()<std::vector<ingredientlist_t,_std::allocator<ingredientlist_t>_>_&,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day21_allergen_assessment_cpp:151:47),_std::identity>
                ((__transform_fn *)&std::ranges::transform,
                 &allergens._M_t._M_impl.super__Rb_tree_header._M_node_count,iVar4._M_current,
                 &occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e8);
      __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e8);
      uVar5 = std::
              accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )__first._M_current,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )__last._M_current,0);
      poVar2 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::string
                ((string *)&allergen_food._M_t._M_impl.super__Rb_tree_header._M_node_count);
      solve_allergens_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_380,(foods_t *)&allergens._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      std::ranges::__for_each_fn::
      operator()<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day21_allergen_assessment_cpp:162:35)>
                ((__for_each_fn *)&std::ranges::for_each,local_380,
                 &allergen_food._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &allergen_food._M_t._M_impl.super__Rb_tree_header._M_node_count);
      poVar2 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &allergen_food._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
      std::operator<<(poVar2,"\n");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &allergen_food._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
      std::operator<<(poVar2,"\n");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_380);
      std::__cxx11::string::~string
                ((string *)&allergen_food._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e8);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&safe._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<ingredientlist_t,_std::allocator<ingredientlist_t>_>::~vector
                ((vector<ingredientlist_t,_std::allocator<ingredientlist_t>_> *)
                 &allergens._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::~variant
              ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)file.
                                              super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                                              .
                                              super__Move_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Move_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Variant_storage_alias<int,_std::basic_ifstream<char>_>
                                              ._520_8_);
    poVar2 = std::operator<<(poVar2," {path-to-file}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto foods = read_foods(tokens);
  auto allergens = all_allergens(foods);
  auto safe = safe_ingredients(foods);

  // Part 1: count occurence of safe ingredients in all food
  auto occurence = std::vector<size_t> (foods.size());
  ranges::transform(foods, occurence.begin(), [&safe](const auto& food){
    return ranges::count_if(food.ingredients, [&safe](const auto& ingredient){
      return safe.contains(ingredient);
    });
  });
  auto a1 = std::accumulate(occurence.cbegin(), occurence.cend(), size_t{0});
  std::cout << "Part 1: " << a1 << "\n";

  // Part 2: solve the allergen-ingredient map
  std::string a2;
  auto allergen_food = solve_allergens(foods);
  ranges::for_each(allergen_food, [&](const auto& af){
    a2.append(af.second);
    a2.push_back(',');
  });
  a2.pop_back();
  std::cout << "Part 2: " << a2 << "\n";
  std::cout << a1 << "\n" << a2 << "\n";
}